

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O1

uint __thiscall
crnlib::command_line_params::find
          (command_line_params *this,uint num_keys,char **ppKeys,
          vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
          *pIterators,vector<unsigned_int> *pUnmatched_indices)

{
  uint uVar1;
  uint *puVar2;
  param_map_const_iterator pVar3;
  ulong uVar4;
  param_map_const_iterator pVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  param_map_const_iterator begin;
  param_map_const_iterator end;
  param_map_const_iterator local_58;
  param_map_const_iterator local_50;
  ulong local_48;
  command_line_params *local_40;
  char **local_38;
  
  local_38 = ppKeys;
  if (pUnmatched_indices != (vector<unsigned_int> *)0x0) {
    uVar1 = (this->m_params).m_size;
    uVar6 = pUnmatched_indices->m_size;
    if (uVar6 != uVar1) {
      if (uVar6 <= uVar1) {
        if (pUnmatched_indices->m_capacity < uVar1) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pUnmatched_indices,uVar1,uVar6 + 1 == uVar1,4,
                     (object_mover)0x0,false);
        }
        memset(pUnmatched_indices->m_p + pUnmatched_indices->m_size,0,
               (ulong)(uVar1 - pUnmatched_indices->m_size) << 2);
      }
      pUnmatched_indices->m_size = uVar1;
    }
    if ((this->m_params).m_size != 0) {
      uVar4 = 0;
      do {
        pUnmatched_indices->m_p[uVar4] = (uint)uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (this->m_params).m_size);
    }
  }
  if (num_keys == 0) {
    uVar9 = 0;
  }
  else {
    uVar4 = 0;
    uVar9 = 0;
    local_48 = (ulong)num_keys;
    local_40 = this;
    do {
      local_58._M_node = (_Rb_tree_node_base *)0x0;
      local_50._M_node = (_Rb_tree_node_base *)0x0;
      find(local_40,local_38[uVar4],&local_58,&local_50);
      pVar3._M_node = local_50._M_node;
      for (pVar5._M_node = local_58._M_node; pVar5._M_node != pVar3._M_node;
          pVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(pVar5._M_node)) {
        local_58._M_node = pVar5._M_node;
        if (pIterators !=
            (vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
             *)0x0) {
          if (*(uint *)(pIterators + 0xc) <= *(uint *)(pIterators + 8)) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)pIterators,*(uint *)(pIterators + 8) + 1,true,8,
                       vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
                       ::object_mover,false);
          }
          *(_Base_ptr *)(*(long *)pIterators + (ulong)*(uint *)(pIterators + 8) * 8) =
               local_58._M_node;
          *(int *)(pIterators + 8) = *(int *)(pIterators + 8) + 1;
        }
        if (pUnmatched_indices != (vector<unsigned_int> *)0x0) {
          puVar2 = pUnmatched_indices->m_p;
          uVar1 = pUnmatched_indices->m_size;
          uVar6 = 0xffffffff;
          if ((ulong)uVar1 != 0) {
            lVar7 = (ulong)uVar1 * 4;
            lVar8 = 0;
            do {
              if (pVar5._M_node[2]._M_color == puVar2[lVar8]) {
                uVar6 = (uint)lVar8;
                break;
              }
              lVar8 = lVar8 + 1;
              lVar7 = lVar7 + -4;
            } while (lVar7 != 0);
          }
          if (-1 < (int)uVar6) {
            if (uVar6 + 1 < uVar1) {
              puVar2[uVar6] = puVar2[uVar1 - 1];
            }
            if (pUnmatched_indices->m_size != 0) {
              pUnmatched_indices->m_size = pUnmatched_indices->m_size - 1;
            }
          }
        }
        uVar9 = uVar9 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_48);
  }
  return uVar9;
}

Assistant:

uint command_line_params::find(uint num_keys, const char** ppKeys, crnlib::vector<param_map_const_iterator>* pIterators, crnlib::vector<uint>* pUnmatched_indices) const {
  CRNLIB_ASSERT(ppKeys);

  if (pUnmatched_indices) {
    pUnmatched_indices->resize(m_params.size());
    for (uint i = 0; i < m_params.size(); i++)
      (*pUnmatched_indices)[i] = i;
  }

  uint n = 0;
  for (uint i = 0; i < num_keys; i++) {
    const char* pKey = ppKeys[i];

    param_map_const_iterator begin, end;
    find(pKey, begin, end);

    while (begin != end) {
      if (pIterators)
        pIterators->push_back(begin);

      if (pUnmatched_indices) {
        int k = pUnmatched_indices->find(begin->second.m_index);
        if (k >= 0)
          pUnmatched_indices->erase_unordered(k);
      }

      n++;
      begin++;
    }
  }

  return n;
}